

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall
ON_SubD::ClearComponentMarks
          (ON_SubD *this,bool bClearVertexMarks,bool bClearEdgeMarks,bool bClearFaceMarks,
          ON_SimpleArray<const_ON_SubDComponentBase_*> *marked_component_list)

{
  bool bVar1;
  ON_SubDVertex *pOVar2;
  char cVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  ON_SubDVertexIterator vit;
  ON_SubDVertex *local_80;
  uint local_74;
  ON_SubD *local_70;
  ON_SubDEdgeIterator local_68;
  
  uVar4 = CONCAT71(in_register_00000009,bClearFaceMarks);
  uVar5 = 0;
  local_74 = (uint)uVar4;
  if ((int)CONCAT71(in_register_00000031,bClearVertexMarks) != 0) {
    local_70 = this;
    ON_SubDVertexIterator::ON_SubDVertexIterator((ON_SubDVertexIterator *)&local_68,this);
    local_68.m_edge_index = 0;
    local_68.m_e_current = local_68.m_e_first;
    uVar5 = 0;
    if ((ON_SubDVertex *)local_68.m_e_first != (ON_SubDVertex *)0x0) {
      pOVar2 = (ON_SubDVertex *)local_68.m_e_first;
      do {
        bVar1 = ON_ComponentStatus::ClearRuntimeMark(&(pOVar2->super_ON_SubDComponentBase).m_status)
        ;
        if (bVar1) {
          if (marked_component_list != (ON_SimpleArray<const_ON_SubDComponentBase_*> *)0x0) {
            local_80 = pOVar2;
            ON_SimpleArray<const_ON_SubDComponentBase_*>::Append
                      (marked_component_list,(ON_SubDComponentBase **)&local_80);
          }
          uVar5 = uVar5 + 1;
        }
        pOVar2 = ON_SubDVertexIterator::NextVertex((ON_SubDVertexIterator *)&local_68);
      } while (pOVar2 != (ON_SubDVertex *)0x0);
    }
    ON_SubDRef::~ON_SubDRef(&local_68.m_subd_ref);
    uVar4 = (ulong)local_74;
    this = local_70;
  }
  cVar3 = (char)uVar4;
  if (bClearEdgeMarks) {
    ON_SubDEdgeIterator::ON_SubDEdgeIterator(&local_68,this);
    local_68.m_edge_index = 0;
    local_68.m_e_current = local_68.m_e_first;
    if ((ON_SubDVertex *)local_68.m_e_first != (ON_SubDVertex *)0x0) {
      pOVar2 = (ON_SubDVertex *)local_68.m_e_first;
      do {
        bVar1 = ON_ComponentStatus::ClearRuntimeMark(&(pOVar2->super_ON_SubDComponentBase).m_status)
        ;
        if (bVar1) {
          if (marked_component_list != (ON_SimpleArray<const_ON_SubDComponentBase_*> *)0x0) {
            local_80 = pOVar2;
            ON_SimpleArray<const_ON_SubDComponentBase_*>::Append
                      (marked_component_list,(ON_SubDComponentBase **)&local_80);
          }
          uVar5 = uVar5 + 1;
        }
        pOVar2 = (ON_SubDVertex *)ON_SubDEdgeIterator::NextEdge(&local_68);
      } while (pOVar2 != (ON_SubDVertex *)0x0);
    }
    ON_SubDRef::~ON_SubDRef(&local_68.m_subd_ref);
    cVar3 = (char)local_74;
  }
  if (cVar3 != '\0') {
    ON_SubDFaceIterator::ON_SubDFaceIterator((ON_SubDFaceIterator *)&local_68,this);
    local_68.m_edge_index = 0;
    local_68.m_e_current = local_68.m_e_first;
    if ((ON_SubDVertex *)local_68.m_e_first != (ON_SubDVertex *)0x0) {
      pOVar2 = (ON_SubDVertex *)local_68.m_e_first;
      do {
        bVar1 = ON_ComponentStatus::ClearRuntimeMark(&(pOVar2->super_ON_SubDComponentBase).m_status)
        ;
        if (bVar1) {
          if (marked_component_list != (ON_SimpleArray<const_ON_SubDComponentBase_*> *)0x0) {
            local_80 = pOVar2;
            ON_SimpleArray<const_ON_SubDComponentBase_*>::Append
                      (marked_component_list,(ON_SubDComponentBase **)&local_80);
          }
          uVar5 = uVar5 + 1;
        }
        pOVar2 = (ON_SubDVertex *)ON_SubDFaceIterator::NextFace((ON_SubDFaceIterator *)&local_68);
      } while (pOVar2 != (ON_SubDVertex *)0x0);
    }
    ON_SubDRef::~ON_SubDRef(&local_68.m_subd_ref);
  }
  return uVar5;
}

Assistant:

unsigned int ON_SubD::ClearComponentMarks(
  bool bClearVertexMarks,
  bool bClearEdgeMarks,
  bool bClearFaceMarks,
  ON_SimpleArray< const ON_SubDComponentBase* >* marked_component_list
) const
{
  unsigned int clear_count = 0;

  if (bClearVertexMarks)
  {
    ON_SubDVertexIterator vit(*this);
    for (const ON_SubDVertex* v = vit.FirstVertex(); nullptr != v; v = vit.NextVertex())
    {
      if (v->m_status.ClearRuntimeMark())
      {
        if (nullptr != marked_component_list)
          marked_component_list->Append(v);
        clear_count++;
      }
    }
  }

  if (bClearEdgeMarks)
  {
    ON_SubDEdgeIterator eit(*this);
    for (const ON_SubDEdge* e = eit.FirstEdge(); nullptr != e; e = eit.NextEdge())
    {
      if (e->m_status.ClearRuntimeMark())
      {
        if (nullptr != marked_component_list)
          marked_component_list->Append(e);
        clear_count++;
      }
    }
  }

  if (bClearFaceMarks)
  {
    ON_SubDFaceIterator fit(*this);
    for (const ON_SubDFace* f = fit.FirstFace(); nullptr != f; f = fit.NextFace())
    {
      if (f->m_status.ClearRuntimeMark())
      {
        if (nullptr != marked_component_list)
          marked_component_list->Append(f);
        clear_count++;
      }
    }
  }

  return clear_count;
}